

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void arena_decay_to_limit
               (tsdn_t *tsdn,arena_t *arena,arena_decay_t *decay,extents_t *extents,_Bool all,
               size_t npages_limit,size_t npages_decay_max,_Bool is_background_thread)

{
  arena_stats_u64_t *paVar1;
  extent_t *peVar2;
  arena_decay_t *paVar3;
  extent_list_t extent;
  _Bool _Var4;
  extent_state_t eVar5;
  extent_t *peVar6;
  long lVar7;
  undefined7 in_register_00000081;
  size_t nstashed;
  ulong uVar8;
  long lVar9;
  extent_hooks_t *extent_hooks;
  extent_hooks_t *local_78;
  undefined4 local_6c;
  arena_decay_t *local_68;
  long local_60;
  extents_t *local_58;
  extent_list_t local_50;
  arena_decay_t *local_48;
  extents_t *local_40;
  ssize_t local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000081,all);
  if (decay->purging == false) {
    decay->purging = true;
    (decay->mtx).field_0.field_0.locked.repr = false;
    local_68 = decay;
    local_58 = extents;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x40));
    local_78 = extent_hooks_get(arena);
    local_50.qlh_first = (extent_t *)0x0;
    for (uVar8 = 0; uVar8 < npages_decay_max; uVar8 = uVar8 + ((peVar6->field_2).e_size_esn >> 0xc))
    {
      peVar6 = extents_evict(tsdn,arena,&local_78,local_58,npages_limit);
      if (peVar6 == (extent_t *)0x0) break;
      if (local_50.qlh_first != (extent_t *)0x0) {
        peVar2 = ((local_50.qlh_first)->ql_link).qre_prev;
        (peVar6->ql_link).qre_prev = peVar2;
        (peVar6->ql_link).qre_next = local_50.qlh_first;
        (peVar2->ql_link).qre_next = peVar6;
        ((local_50.qlh_first)->ql_link).qre_prev = peVar6;
      }
      local_50.qlh_first = (peVar6->ql_link).qre_next;
    }
    if (uVar8 != 0) {
      local_38 = (arena->decay_muzzy).time_ms.repr;
      local_40 = &arena->extents_muzzy;
      local_48 = &arena->decay_dirty;
      lVar7 = 0;
      local_60 = 0;
      lVar9 = 0;
      while (extent.qlh_first = local_50.qlh_first, local_50.qlh_first != (extent_t *)0x0) {
        uVar8 = ((local_50.qlh_first)->field_2).e_size_esn >> 0xc;
        extent_list_remove(&local_50,local_50.qlh_first);
        eVar5 = extents_state_get(local_58);
        if (((eVar5 == extent_state_muzzy) || ((char)local_6c != '\0')) || (local_38 == 0)) {
LAB_001121bc:
          extent_dalloc_wrapper(tsdn,arena,&local_78,extent.qlh_first);
          local_60 = local_60 + uVar8;
        }
        else {
          _Var4 = extent_purge_lazy_wrapper
                            (tsdn,arena,&local_78,extent.qlh_first,0,
                             ((extent.qlh_first)->field_2).e_size_esn & 0xfffffffffffff000);
          if (_Var4) goto LAB_001121bc;
          extents_dalloc(tsdn,arena,&local_78,local_40,extent.qlh_first);
          if ((((~background_thread_enabled_state.repr | is_background_thread) & 1U) == 0) &&
             ((background_thread_info[(ulong)arena->base->ind % max_background_threads].
               indefinite_sleep.repr & 1U) != 0)) {
            background_thread_interval_check(tsdn,arena,local_48,0);
          }
        }
        lVar7 = lVar7 + uVar8;
        lVar9 = lVar9 + 1;
      }
      LOCK();
      (local_68->stats->npurge).repr = (local_68->stats->npurge).repr + 1;
      UNLOCK();
      LOCK();
      paVar1 = &local_68->stats->nmadvise;
      paVar1->repr = paVar1->repr + lVar9;
      UNLOCK();
      LOCK();
      paVar1 = &local_68->stats->purged;
      paVar1->repr = paVar1->repr + lVar7;
      UNLOCK();
      LOCK();
      (arena->stats).mapped.repr = (arena->stats).mapped.repr + local_60 * -0x1000;
      UNLOCK();
    }
    paVar3 = local_68;
    malloc_mutex_lock(tsdn,&local_68->mtx);
    paVar3->purging = false;
  }
  return;
}

Assistant:

static void
arena_decay_to_limit(tsdn_t *tsdn, arena_t *arena, arena_decay_t *decay,
    extents_t *extents, bool all, size_t npages_limit, size_t npages_decay_max,
    bool is_background_thread) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 1);
	malloc_mutex_assert_owner(tsdn, &decay->mtx);

	if (decay->purging) {
		return;
	}
	decay->purging = true;
	malloc_mutex_unlock(tsdn, &decay->mtx);

	extent_hooks_t *extent_hooks = extent_hooks_get(arena);

	extent_list_t decay_extents;
	extent_list_init(&decay_extents);

	size_t npurge = arena_stash_decayed(tsdn, arena, &extent_hooks, extents,
	    npages_limit, npages_decay_max, &decay_extents);
	if (npurge != 0) {
		size_t npurged = arena_decay_stashed(tsdn, arena,
		    &extent_hooks, decay, extents, all, &decay_extents,
		    is_background_thread);
		assert(npurged == npurge);
	}

	malloc_mutex_lock(tsdn, &decay->mtx);
	decay->purging = false;
}